

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsgridlayout.cpp
# Opt level: O0

QGraphicsLayoutItem * __thiscall QGraphicsGridLayout::itemAt(QGraphicsGridLayout *this,int index)

{
  int iVar1;
  QGraphicsGridLayoutPrivate *pQVar2;
  QGraphicsGridLayoutEngineItem *this_00;
  uint in_ESI;
  long in_FS_OFFSET;
  QGraphicsGridLayoutEngineItem *engineItem;
  QGraphicsGridLayoutPrivate *d;
  char *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  int line;
  undefined4 in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  QMessageLogger *in_stack_ffffffffffffffb0;
  QGraphicsLayoutItem *local_30;
  char local_28 [32];
  long local_8;
  
  line = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QGraphicsGridLayout *)0x96e219);
  if (-1 < (int)in_ESI) {
    in_stack_ffffffffffffffac = in_ESI;
    iVar1 = QGridLayoutEngine::itemCount();
    if ((int)in_stack_ffffffffffffffac < iVar1) {
      this_00 = (QGraphicsGridLayoutEngineItem *)QGridLayoutEngine::itemAt((int)pQVar2 + 0x118);
      if (this_00 == (QGraphicsGridLayoutEngineItem *)0x0) {
        local_30 = (QGraphicsLayoutItem *)0x0;
      }
      else {
        local_30 = QGraphicsGridLayoutEngineItem::layoutItem(this_00);
      }
      goto LAB_0096e2b9;
    }
  }
  QMessageLogger::QMessageLogger
            (in_stack_ffffffffffffffb0,
             (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),line,
             in_stack_ffffffffffffff98);
  QMessageLogger::warning(local_28,"QGraphicsGridLayout::itemAt: invalid index %d",(ulong)in_ESI);
  local_30 = (QGraphicsLayoutItem *)0x0;
LAB_0096e2b9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_30;
  }
  __stack_chk_fail();
}

Assistant:

QGraphicsLayoutItem *QGraphicsGridLayout::itemAt(int index) const
{
    Q_D(const QGraphicsGridLayout);
    if (index < 0 || index >= d->engine.itemCount()) {
        qWarning("QGraphicsGridLayout::itemAt: invalid index %d", index);
        return nullptr;
    }
    if (QGraphicsGridLayoutEngineItem *engineItem = static_cast<QGraphicsGridLayoutEngineItem*>(d->engine.itemAt(index)))
        return engineItem->layoutItem();
    return nullptr;
}